

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

bool __thiscall
ObjectFile::setAttribute(ObjectFile *this,CK_ATTRIBUTE_TYPE type,OSAttribute *attribute)

{
  undefined8 uVar1;
  mapped_type *ppOVar2;
  mapped_type this_00;
  OSAttribute *in_RDI;
  MutexLocker lock;
  bool in_stack_0000007f;
  ObjectFile *in_stack_00000080;
  Mutex *in_stack_ffffffffffffff88;
  MutexLocker *in_stack_ffffffffffffff90;
  OSAttribute *in_stack_ffffffffffffffc0;
  key_type *in_stack_ffffffffffffffc8;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if (((in_RDI->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_node_count & 1) == 0) {
    uVar1 = std::__cxx11::string::c_str();
    softHSMLog(7,"setAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0xd5,"Cannot update invalid object %s",uVar1);
    local_1 = false;
  }
  else {
    MutexLocker::MutexLocker(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    ppOVar2 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (*ppOVar2 != (mapped_type)0x0) {
      ppOVar2 = std::
                map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (*ppOVar2 != (mapped_type)0x0) {
        (*(*ppOVar2)->_vptr_OSAttribute[1])();
      }
      ppOVar2 = std::
                map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      *ppOVar2 = (mapped_type)0x0;
    }
    this_00 = (mapped_type)operator_new(0xa0);
    OSAttribute::OSAttribute(in_stack_ffffffffffffffc0,in_RDI);
    ppOVar2 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *ppOVar2 = this_00;
    MutexLocker::~MutexLocker((MutexLocker *)this_00);
    store(in_stack_00000080,in_stack_0000007f);
    local_1 = (bool)((byte)(in_RDI->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_node_count &
                    1);
  }
  return local_1;
}

Assistant:

bool ObjectFile::setAttribute(CK_ATTRIBUTE_TYPE type, const OSAttribute& attribute)
{
	if (!valid)
	{
		DEBUG_MSG("Cannot update invalid object %s", path.c_str());

		return false;
	}

	{
		MutexLocker lock(objectMutex);

		if (attributes[type] != NULL)
		{
			delete attributes[type];

			attributes[type] = NULL;
		}

		attributes[type] = new OSAttribute(attribute);
	}

	store();

	return valid;
}